

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::ApproxQuantileDecimalListFunction
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  GetApproxQuantileListAggregateFunction(__return_storage_ptr__,type);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->field_0x8,0,
             *(char **)&__return_storage_ptr__->field_0x10,0x76c70b);
  __return_storage_ptr__->serialize = ApproximateQuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = ApproximateQuantileBindData::Deserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction ApproxQuantileDecimalListFunction(const LogicalType &type) {
	auto function = GetApproxQuantileListAggregateFunction(type);
	function.name = "approx_quantile";
	function.serialize = ApproximateQuantileBindData::Serialize;
	function.deserialize = ApproximateQuantileBindData::Deserialize;
	return function;
}